

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_symphony.c
# Opt level: O3

int32_t ll_get_state(ll_state *state,ll_tx_state *tx_state,ll_rx_state *rx_state)

{
  _Bool _Var1;
  uint uVar2;
  
  _Var1 = transport_mutex_grab();
  if (!_Var1) {
    return -0x71;
  }
  if (state == (ll_state *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = hal_read_write(OP_STATE,(uint8_t *)0x0,0,_ll_ifc_message_buff,1);
    if ((int)uVar2 < 0) goto LAB_001065a8;
    *state = (int)(char)_ll_ifc_message_buff[0];
  }
  if (tx_state != (ll_tx_state *)0x0) {
    uVar2 = hal_read_write(OP_TX_STATE,(uint8_t *)0x0,0,_ll_ifc_message_buff,1);
    if ((int)uVar2 < 0) goto LAB_001065a8;
    *tx_state = (int)(char)_ll_ifc_message_buff[0];
  }
  if ((rx_state != (ll_rx_state *)0x0) &&
     (uVar2 = hal_read_write(OP_RX_STATE,(uint8_t *)0x0,0,_ll_ifc_message_buff,1), -1 < (int)uVar2))
  {
    *rx_state = (int)(char)_ll_ifc_message_buff[0];
  }
LAB_001065a8:
  transport_mutex_release();
  return (int)uVar2 >> 0x1f & uVar2;
}

Assistant:

int32_t ll_get_state(enum ll_state *state, enum ll_tx_state *tx_state, enum ll_rx_state *rx_state)
{
    int32_t ret = LL_IFC_ACK;

    if (!(transport_mutex_grab()))
    {
        return LL_IFC_ERROR_HAL_CALL_FAILED;
    }

    if (NULL != state)
    {
        uint8_t u8_state;
        ret = hal_read_write(OP_STATE, NULL, 0, &_ll_ifc_message_buff[0], 1);
        if (LL_IFC_ACK > ret)
        {
            goto GET_STATE_ERROR;
        }
        *state = (enum ll_state)(int8_t)_ll_ifc_message_buff[0];
    }

    if (NULL != tx_state)
    {
        uint8_t u8_tx_state;
        ret = hal_read_write(OP_TX_STATE, NULL, 0, &_ll_ifc_message_buff[0], 1);
        if (LL_IFC_ACK > ret)
        {
            goto GET_STATE_ERROR;
        }
        *tx_state = (enum ll_tx_state)(int8_t)_ll_ifc_message_buff[0];
    }

    if (NULL != rx_state)
    {
        uint8_t u8_rx_state;
        ret = hal_read_write(OP_RX_STATE, NULL, 0, &_ll_ifc_message_buff[0], 1);
        if (LL_IFC_ACK > ret)
        {
            goto GET_STATE_ERROR;
        }
        *rx_state = (enum ll_rx_state)(int8_t)_ll_ifc_message_buff[0];
    }

GET_STATE_ERROR:
    transport_mutex_release();
    return (ret >= 0) ? LL_IFC_ACK : ret;
}